

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stack.cpp
# Opt level: O3

bool test3(void)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int local_3c;
  void *local_38;
  iterator iStack_30;
  int *local_28;
  
  iVar3 = 0;
  do {
    local_38 = (void *)0x0;
    iStack_30._M_current = (int *)0x0;
    local_28 = (int *)0x0;
    local_3c = 0;
    do {
      if (iStack_30._M_current == local_28) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_38,iStack_30,&local_3c);
      }
      else {
        *iStack_30._M_current = local_3c;
        iStack_30._M_current = iStack_30._M_current + 1;
      }
      iVar1 = local_3c + 1;
      bVar2 = local_3c < 999999;
      local_3c = iVar1;
    } while (bVar2);
    iStack_30._M_current = iStack_30._M_current + -1000000;
    if (local_38 != (void *)0x0) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x14);
  return true;
}

Assistant:

bool test3() {
  int nRun = 20;
  int nData = 1000000;
  for (int i = 0;i < nRun;i++) {
    Stack s;
    for (int j = 0;j < nData;j++) {
      s.push(j);
    }
    for (int j = 0;j < nData;j++) {
      s.pop();
    }
  }
  return true;
}